

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O2

Ptr express(TokenReader *tokens)

{
  Token *tokens_00;
  SimpleASTNode *pSVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  invalid_argument *piVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar4;
  undefined1 local_100 [32];
  __shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> local_e0;
  __shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> local_d0;
  __shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> local_c0;
  undefined1 local_b0 [8];
  Token token;
  Ptr child2;
  undefined1 local_54 [12];
  Ptr child1_1;
  Ptr child1;
  
  andExpress((TokenReader *)(local_54 + 4));
  std::__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)
             &child1_1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)(local_54 + 4));
  tokens_00 = (Token *)((long)&token.val.field_2 + 8);
  while( true ) {
    TokenReader::peek();
    if ((child1_1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) || (local_b0._0_4_ != OR_TYPE)) break;
    TokenReader::read();
    Token::operator=((Token *)local_b0,tokens_00);
    std::__cxx11::string::~string((string *)&child2);
    andExpress((TokenReader *)tokens_00);
    local_54._0_4_ = 6;
    std::make_shared<SimpleASTNode,ASTNodeType_const&,std::__cxx11::string_const&>
              ((ASTNodeType *)local_100,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_54);
    std::__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)
               &child1_1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)local_100);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_100 + 8));
    _Var2 = child1_1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)(local_100 + 0x10),
               (__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)(local_54 + 4));
    SimpleASTNode::addChild((SimpleASTNode *)_Var2._M_pi,(Ptr *)(local_100 + 0x10));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_100 + 0x18));
    _Var2 = child1_1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    if (token.val.field_2._8_8_ == 0) {
      piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar3,"\"||\" Light argument is required!");
      __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    std::__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_e0,(__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)tokens_00);
    SimpleASTNode::addChild((SimpleASTNode *)_Var2._M_pi,(Ptr *)&local_e0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0._M_refcount);
    std::__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)(local_54 + 4),
               (__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)
               &child1_1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&child2);
    std::__cxx11::string::~string((string *)&token);
  }
  std::__cxx11::string::~string((string *)&token);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&child1_1);
  std::__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)tokens,
             (__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)
             &child1_1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  TokenReader::peek();
  if ((*(long *)tokens != 0) && (local_b0._0_4_ == ASSIGN_TYPE)) {
    TokenReader::read();
    Token::operator=((Token *)local_b0,(Token *)((long)&token.val.field_2 + 8));
    std::__cxx11::string::~string((string *)&child2);
    express((TokenReader *)(token.val.field_2._M_local_buf + 8));
    local_100._0_4_ = 3;
    std::make_shared<SimpleASTNode,ASTNodeType_const&,std::__cxx11::string_const&>
              ((ASTNodeType *)(local_54 + 4),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
    std::__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)tokens,
               (__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)(local_54 + 4));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&child1_1);
    pSVar1 = *(SimpleASTNode **)tokens;
    std::__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_d0,
               (__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)
               &child1_1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    SimpleASTNode::addChild(pSVar1,(Ptr *)&local_d0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d0._M_refcount);
    if (token.val.field_2._8_8_ == 0) {
      piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar3,"An valid expression is required!");
      __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    pSVar1 = *(SimpleASTNode **)tokens;
    std::__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_c0,
               (__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&token.val.field_2 + 8));
    SimpleASTNode::addChild(pSVar1,(Ptr *)&local_c0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&child2);
  }
  std::__cxx11::string::~string((string *)&token);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&child1);
  PVar4.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar4.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)tokens;
  return (Ptr)PVar4.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static SimpleASTNode::Ptr express(TokenReader& tokens)
{
    //std::cout << "in express" << std::endl;
    SimpleASTNode::Ptr child1 = orExpress(tokens);
    SimpleASTNode::Ptr node = child1;
    Token token = tokens.peek();
    if (node != nullptr && !token.isEmpty()) {
        if (token.type == TokenType::ASSIGN_TYPE) {
            token = tokens.read(); //consume "="
            SimpleASTNode::Ptr child2 = express(tokens);
            node = SimpleASTNode::create(ASTNodeType::ASSIGMENT, token.val);
            node->addChild(child1);
            if (child2 != nullptr)
                node->addChild(child2);
            else
                throw std::invalid_argument("An valid expression is required!");
        }
    }
    return node;
}